

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O0

int append_str(CharBuff *buff,char *c)

{
  int iVar1;
  unsigned_long uVar2;
  int local_2c;
  int i;
  unsigned_long len;
  char *c_local;
  CharBuff *buff_local;
  
  uVar2 = str_len_(c);
  local_2c = 0;
  while( true ) {
    if (uVar2 <= (ulong)(long)local_2c) {
      return 1;
    }
    iVar1 = sbuff_write(buff,c[local_2c]);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int append_str(CharBuff* buff, const char *c){
    unsigned long len = str_len_(c);
    for (int i = 0; i < len; ++i) {
        if (sbuff_write(buff, c[i])  == 0)return false;
    }
    return true;
}